

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O2

int __thiscall CVmConsoleMain::set_more_state(CVmConsoleMain *this,int state)

{
  int iVar1;
  
  iVar1 = G_os_moremode;
  G_os_moremode = state;
  return iVar1;
}

Assistant:

virtual int set_more_state(int state)
    {
        int old_state;

        /* remember the old state */
        old_state = G_os_moremode;

        /* set the new mode */
        G_os_moremode = state;

        /* return the previous state */
        return old_state;
    }